

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O1

void EthBasePort::PrintDebugData(ostream *debugStream,quadlet_t *data,double clockPeriod)

{
  long lVar1;
  long lVar2;
  char cVar3;
  bool bVar4;
  ostream *poVar5;
  long *plVar6;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"PrintDebugData","");
  bVar4 = CheckDebugHeader(debugStream,&local_48,(char *)data,2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    std::__ostream_insert<char,std::char_traits<char>>(debugStream,"Timestamp: ",0xb);
    *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) =
         *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)debugStream);
    lVar1 = *(long *)poVar5;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffffb5 | 2;
    std::ios::widen((char)*(undefined8 *)(lVar1 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if ((int)data[2] < 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"wrReq ",6);
    }
    if ((*(byte *)((long)data + 0xb) & 0x20) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"bw_active ",10);
    }
    if ((*(byte *)((long)data + 0xb) & 0x10) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"eth_send_idle ",0xe);
    }
    if ((*(byte *)((long)data + 0xb) & 8) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"eth_recv_idle ",0xe);
    }
    if ((*(byte *)((long)data + 0xb) & 4) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"UDPError ",9);
    }
    if ((*(byte *)((long)data + 0xb) & 1) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"IPV4Error ",10);
    }
    if ((*(byte *)((long)data + 10) & 0x80) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"sendBusy ",9);
    }
    if ((*(byte *)((long)data + 10) & 0x40) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"sendRequest ",0xc);
    }
    if ((*(byte *)((long)data + 10) & 0x20) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"eth_send_fw_ack ",0x10);
    }
    if ((*(byte *)((long)data + 10) & 0x10) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"eth_send_fw_req ",0x10);
    }
    cVar3 = (char)debugStream;
    std::ios::widen((char)*(undefined8 *)(*(long *)debugStream + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    if ((*(byte *)((long)data + 10) & 8) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"recvBusy ",9);
    }
    if ((*(byte *)((long)data + 10) & 4) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"recvRequest ",0xc);
    }
    if ((*(byte *)((long)data + 10) & 2) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"isLocal ",8);
    }
    if ((*(byte *)((long)data + 10) & 1) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"isRemote ",9);
    }
    if ((*(byte *)((long)data + 9) & 0x80) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"fwPacketFresh ",0xe);
    }
    if ((*(byte *)((long)data + 9) & 0x40) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"isForward ",10);
    }
    if ((*(byte *)((long)data + 9) & 0x20) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"sendARP ",8);
    }
    if ((*(byte *)((long)data + 9) & 0x10) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"isUDP ",6);
    }
    if ((*(byte *)((long)data + 9) & 8) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"isICMP  ",8);
    }
    if ((*(byte *)((long)data + 9) & 4) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"isEcho ",7);
    }
    if ((*(byte *)((long)data + 9) & 2) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"ipv4_long ",10);
    }
    if ((*(byte *)((long)data + 9) & 1) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"ipv4_short ",0xb);
    }
    if ((data[2] & 0x80) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"fw_bus_reset ",0xd);
    }
    if ((data[2] & 0x40) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"ipWrite ",8);
    }
    if ((data[2] & 0x20) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"hubSend ",8);
    }
    if ((data[2] & 0x10) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"bcResp ",7);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)debugStream + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(debugStream,"FireWire node_id: ",0x12);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)debugStream);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(debugStream,"LengthFW: ",10);
    *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) =
         *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)debugStream);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(debugStream,"MaxCountFW: ",0xc);
    *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) =
         *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) & 0xffffffb5 | 2;
    plVar6 = (long *)std::ostream::operator<<
                               ((ostream *)debugStream,*(ushort *)((long)data + 0xe) & 0x3ff);
    std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
    std::ostream::put((char)plVar6);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(debugStream,"FwCtrl: ",8);
    *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) =
         *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)debugStream);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(debugStream,"Host FW Addr: ",0xe);
    *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) =
         *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)debugStream);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(debugStream,"Fw Bus Generation: ",0x13);
    *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) =
         *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::ostream::_M_insert<unsigned_long>((ulong)debugStream);
    std::ios::widen((char)*(undefined8 *)(*(long *)debugStream + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(debugStream,"sendState: ",0xb);
    *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) =
         *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar5 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)debugStream,(uint)(*(ushort *)((long)data + 0x16) >> 0xc));
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", recvState: ",0xd);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,data[5] >> 0xc & 7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", nextRecv: ",0xc);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,*(byte *)((long)data + 0x15) & 7)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", recvCnt: ",0xb);
    plVar6 = (long *)std::ostream::operator<<((ostream *)poVar5,(ushort)data[5] & 0x3f);
    std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
    std::ostream::put((char)plVar6);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(debugStream,"numIPv4: ",9);
    *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) =
         *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)debugStream);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(debugStream,"numUDP: ",8);
    *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) =
         *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)debugStream);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(debugStream,"numARP: ",8);
    *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) =
         *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)debugStream);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(debugStream,"numICMP: ",9);
    *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) =
         *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)debugStream);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(debugStream,"numMulticastWrite: ",0x13);
    *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) =
         *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)debugStream);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(debugStream,"br_wait: ",9);
    *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) =
         *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)debugStream);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(debugStream,"numPacketError: ",0x10);
    *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) =
         *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)debugStream);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(debugStream,"bwState: ",9);
    *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) =
         *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::ostream::_M_insert<unsigned_long>((ulong)debugStream);
    if (*(char *)((long)data + 0x21) < '\0') {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,", bw_err",8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)debugStream + -0x18) + cVar3);
    std::ostream::put(cVar3);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"bw_left: ",9);
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(debugStream,"fw_left: ",9);
    std::ostream::_M_insert<unsigned_long>((ulong)debugStream);
    if (*(char *)((long)data + 0x25) < '\0') {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,", fw_err",8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(debugStream,", fw_wait_cnt: ",0xf);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)debugStream);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if ((short)data[10] != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"Unsupported UDP port: ",0x16);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)debugStream);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
  }
  return;
}

Assistant:

void EthBasePort::PrintDebugData(std::ostream &debugStream, const quadlet_t *data, double clockPeriod)
{
    // Following structure must match DebugData in EthernetIO.v
    struct DebugData {
        char     header[4];        // Quad 0
        uint32_t timestampBegin;   // Quad 1
        uint32_t statusbits;       // Quad 2
        uint16_t LengthFW;         // Quad 3
        uint16_t quad3_high;
        uint16_t Host_FW_Addr;     // Quad 4
        uint16_t FwCtrl;
        uint16_t quad5_low;        // Quad 5
        uint16_t quad5_high;
        uint16_t numIPv4;          // Quad 6
        uint16_t numUDP;
        uint8_t  numARP;           // Quad 7
        uint8_t  fw_bus_gen;
        uint8_t  numICMP;
        uint8_t  br_wait_cnt;
        uint8_t  numPacketError;   // Quad 8
        uint8_t  bwState;
        uint16_t bw_left;
        uint8_t  fw_wait_cnt;      // Quad 9
        uint8_t  fwState;
        uint16_t fw_left;
        uint16_t port_unknown;     // Quad 10
        uint8_t  numMulticastWrite;
        uint8_t  quad10_high;
        uint32_t unused[5];        // Quads 10-15
    };
    if (sizeof(DebugData) != 16*sizeof(quadlet_t)) {
        debugStream << "PrintDebugData: structure packing problem" << std::endl;
        return;
    }
    const DebugData *p = reinterpret_cast<const DebugData *>(data);
    if (!CheckDebugHeader(debugStream, "PrintDebugData", p->header, 2))
        return;

    debugStream << "Timestamp: " << std::hex << p->timestampBegin << std::dec << std::endl;
    if (p->statusbits & 0x80000000) debugStream << "wrReq ";
    if (p->statusbits & 0x20000000) debugStream << "bw_active ";
    if (p->statusbits & 0x10000000) debugStream << "eth_send_idle ";
    if (p->statusbits & 0x08000000) debugStream << "eth_recv_idle ";
    if (p->statusbits & 0x04000000) debugStream << "UDPError ";
    if (p->statusbits & 0x01000000) debugStream << "IPV4Error ";
    if (p->statusbits & 0x00800000) debugStream << "sendBusy ";
    if (p->statusbits & 0x00400000) debugStream << "sendRequest ";
    if (p->statusbits & 0x00200000) debugStream << "eth_send_fw_ack ";
    if (p->statusbits & 0x00100000) debugStream << "eth_send_fw_req ";
    debugStream << std::endl;
    if (p->statusbits & 0x00080000) debugStream << "recvBusy ";
    if (p->statusbits & 0x00040000) debugStream << "recvRequest ";
    if (p->statusbits & 0x00020000) debugStream << "isLocal ";
    if (p->statusbits & 0x00010000) debugStream << "isRemote ";
    if (p->statusbits & 0x00008000) debugStream << "fwPacketFresh ";
    if (p->statusbits & 0x00004000) debugStream << "isForward ";
    if (p->statusbits & 0x00002000) debugStream << "sendARP ";
    if (p->statusbits & 0x00001000) debugStream << "isUDP ";
    if (p->statusbits & 0x00000800) debugStream << "isICMP  ";
    if (p->statusbits & 0x00000400) debugStream << "isEcho ";
    if (p->statusbits & 0x00000200) debugStream << "ipv4_long ";
    if (p->statusbits & 0x00000100) debugStream << "ipv4_short ";
    if (p->statusbits & 0x00000080) debugStream << "fw_bus_reset ";
    if (p->statusbits & 0x00000040) debugStream << "ipWrite ";
    if (p->statusbits & 0x00000020) debugStream << "hubSend ";
    if (p->statusbits & 0x00000010) debugStream << "bcResp ";
    debugStream << std::endl;
    unsigned int node_id = (p->quad3_high&0xfc00) >> 10;    // node_is is upper 6 bits
    debugStream << "FireWire node_id: " << node_id << std::endl;
    debugStream << "LengthFW: " << std::dec << p->LengthFW << std::endl;
    debugStream << "MaxCountFW: " << std::dec << (p->quad3_high&0x3ff) << std::endl;
    debugStream << "FwCtrl: " << std::hex << p->FwCtrl << std::endl;
    debugStream << "Host FW Addr: " << std::hex << p->Host_FW_Addr << std::endl;
    debugStream << "Fw Bus Generation: " << std::dec << static_cast<uint16_t>(p->fw_bus_gen);
    debugStream << std::endl;
    debugStream << "sendState: "   << std::dec << (p->quad5_high>>12)
                << ", recvState: " << ((p->quad5_low&0x7000)>>12)
                << ", nextRecv: "  << ((p->quad5_low&0x0700)>>8)
                << ", recvCnt: " << (p->quad5_low&0x003f) << std::endl;
    debugStream << "numIPv4: " << std::dec << p->numIPv4 << std::endl;
    debugStream << "numUDP: " << std::dec << p->numUDP << std::endl;
    debugStream << "numARP: " << std::dec << static_cast<uint16_t>(p->numARP) << std::endl;
    debugStream << "numICMP: " << std::dec << static_cast<uint16_t>(p->numICMP) << std::endl;
    debugStream << "numMulticastWrite: " << std::dec << static_cast<uint16_t>(p->numMulticastWrite) << std::endl;
    debugStream << "br_wait: " << std::dec << static_cast<uint16_t>(p->br_wait_cnt) << std::endl;
    debugStream << "numPacketError: " << std::dec << static_cast<uint16_t>(p->numPacketError) << std::endl;
    debugStream << "bwState: " << std::dec << static_cast<uint16_t>(p->bwState & 0x07);
    if (p->bwState & 0x80) debugStream << ", bw_err";
    debugStream << std::endl << "bw_left: " << std::dec << p->bw_left << std::endl;
    debugStream << "fw_left: " << p->fw_left;
    if (p->fwState & 0x80) debugStream << ", fw_err";
    debugStream << ", fw_wait_cnt: " << static_cast<uint16_t>(p->fw_wait_cnt) << std::endl;
    if (p->port_unknown)
        debugStream << "Unsupported UDP port: " << p->port_unknown << std::endl;
}